

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

AsmJsScriptFunction * __thiscall
Js::JavascriptLibrary::CreateAsmJsScriptFunction(JavascriptLibrary *this,FunctionProxy *proxy)

{
  code *pcVar1;
  bool bVar2;
  Type TVar3;
  ScriptFunctionType *deferredPrototypeType;
  undefined4 *puVar4;
  Recycler *pRVar5;
  FunctionWithComputedName<Js::AsmJsScriptFunction> *this_00;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  deferredPrototypeType = FunctionProxy::EnsureDeferredPrototypeType(proxy);
  TVar3 = ((proxy->functionInfo).ptr)->attributes;
  if ((TVar3 >> 0x19 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x18f8,"(!proxy->GetFunctionInfo()->HasHomeObj())",
                                "!proxy->GetFunctionInfo()->HasHomeObj()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    TVar3 = ((proxy->functionInfo).ptr)->attributes;
  }
  if ((TVar3 >> 0x17 & 1) == 0) {
    local_58 = (undefined1  [8])&AsmJsScriptFunction::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x18fd;
    pRVar5 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
    this_00 = (FunctionWithComputedName<Js::AsmJsScriptFunction> *)
              new<(Memory::ObjectInfoBits)1>
                        (0x50,pRVar5,(InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27)
    ;
    AsmJsScriptFunction::AsmJsScriptFunction
              ((AsmJsScriptFunction *)this_00,proxy,deferredPrototypeType);
  }
  else {
    local_58 = (undefined1  [8])&FunctionWithComputedName<Js::AsmJsScriptFunction>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x18fb;
    pRVar5 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
    this_00 = (FunctionWithComputedName<Js::AsmJsScriptFunction> *)
              new<(Memory::ObjectInfoBits)1>
                        (0x58,pRVar5,(InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27)
    ;
    FunctionWithComputedName<Js::AsmJsScriptFunction>::FunctionWithComputedName
              (this_00,proxy,deferredPrototypeType);
  }
  return &this_00->super_AsmJsScriptFunction;
}

Assistant:

AsmJsScriptFunction* JavascriptLibrary::CreateAsmJsScriptFunction(FunctionProxy * proxy)
    {
        ScriptFunctionType* deferredPrototypeType = proxy->EnsureDeferredPrototypeType();
        Assert(!proxy->GetFunctionInfo()->HasHomeObj());
        if (proxy->GetFunctionInfo()->HasComputedName())
        {
            return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, AsmJsScriptFunctionWithComputedName, proxy, deferredPrototypeType);
        }
        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, AsmJsScriptFunction, proxy, deferredPrototypeType);
    }